

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

void ThrustThingHelper(AActor *it,DAngle *angle,double force,INTBOOL nolimit)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  DAngle local_18;
  
  local_18 = (DAngle)angle->Degrees;
  AActor::Thrust(it,&local_18,force);
  if (nolimit == 0) {
    auVar1._0_8_ = (it->Vel).X;
    auVar1._8_8_ = (it->Vel).Y;
    auVar2 = minpd(_DAT_006961c0,auVar1);
    (it->Vel).X = (double)(~-(ulong)(-30.0 < (double)auVar1._0_8_) & 0xc03e000000000000 |
                          auVar2._0_8_ & -(ulong)(-30.0 < (double)auVar1._0_8_));
    (it->Vel).Y = (double)(~-(ulong)(-30.0 < (double)auVar1._8_8_) & 0xc03e000000000000 |
                          auVar2._8_8_ & -(ulong)(-30.0 < (double)auVar1._8_8_));
  }
  return;
}

Assistant:

static void ThrustThingHelper(AActor *it, DAngle angle, double force, INTBOOL nolimit)
{
	it->Thrust(angle, force);
	if (!nolimit)
	{
		it->Vel.X = clamp(it->Vel.X, -MAXMOVE, MAXMOVE);
		it->Vel.Y = clamp(it->Vel.Y, -MAXMOVE, MAXMOVE);
	}
}